

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

int Cec2_ManSimulate(Gia_Man_t *p,Vec_Int_t *vTriples,Cec2_Man_t *pMan)

{
  int iVar1;
  int iObj_00;
  int Lit;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  abctime aVar6;
  word *p_00;
  word *p_01;
  bool bVar7;
  int fPhase;
  int iPat;
  word *pSim1;
  word *pSim0;
  int Count;
  int Entry;
  int iObj;
  int iRepr;
  int i;
  Gia_Obj_t *pObj;
  abctime clk;
  Cec2_Man_t *pMan_local;
  Vec_Int_t *vTriples_local;
  Gia_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  pSim0._4_4_ = 0;
  iObj = 0;
  while( true ) {
    bVar7 = false;
    if (iObj < p->nObjs) {
      _iRepr = Gia_ManObj(p,iObj);
      bVar7 = _iRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_iRepr);
    if (iVar1 != 0) {
      Cec2_ObjSimAnd(p,iObj);
    }
    iObj = iObj + 1;
  }
  aVar6 = Abc_Clock();
  pMan->timeSim = (aVar6 - aVar5) + pMan->timeSim;
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    if (vTriples != (Vec_Int_t *)0x0) {
      for (iObj = 0; iVar1 = Vec_IntSize(vTriples), iObj + 2 < iVar1; iObj = iObj + 3) {
        iVar1 = Vec_IntEntry(vTriples,iObj);
        iObj_00 = Vec_IntEntry(vTriples,iObj + 1);
        Lit = Vec_IntEntry(vTriples,iObj + 2);
        p_00 = Cec2_ObjSim(p,iVar1);
        p_01 = Cec2_ObjSim(p,iObj_00);
        iVar1 = Abc_Lit2Var(Lit);
        uVar2 = Abc_LitIsCompl(Lit);
        uVar3 = Abc_InfoHasBit((uint *)p_00,iVar1);
        uVar4 = Abc_InfoHasBit((uint *)p_01,iVar1);
        if ((uVar2 ^ uVar3) == uVar4) {
          pSim0._4_4_ = pSim0._4_4_ + 1;
        }
      }
    }
    aVar5 = Abc_Clock();
    for (iObj = 0; iVar1 = Gia_ManObjNum(p), iObj < iVar1; iObj = iObj + 1) {
      iVar1 = Gia_ObjIsHead(p,iObj);
      if (iVar1 != 0) {
        Cec2_ManSimClassRefineOne(p,iObj);
      }
    }
    aVar6 = Abc_Clock();
    pMan->timeRefine = (aVar6 - aVar5) + pMan->timeRefine;
    p_local._4_4_ = pSim0._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

int Cec2_ManSimulate( Gia_Man_t * p, Vec_Int_t * vTriples, Cec2_Man_t * pMan )
{
    extern void Cec2_ManSimClassRefineOne( Gia_Man_t * p, int iRepr );
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; 
    int i, iRepr, iObj, Entry, Count = 0;
    //Cec2_ManSaveCis( p );
    Gia_ManForEachAnd( p, pObj, i )
        Cec2_ObjSimAnd( p, i );
    pMan->timeSim += Abc_Clock() - clk;
    if ( p->pReprs == NULL )
        return 0;
    if ( vTriples )
    {
        Vec_IntForEachEntryTriple( vTriples, iRepr, iObj, Entry, i )
        {
            word * pSim0 = Cec2_ObjSim( p, iRepr );
            word * pSim1 = Cec2_ObjSim( p, iObj );
            int iPat     = Abc_Lit2Var(Entry);
            int fPhase   = Abc_LitIsCompl(Entry);
            if ( (fPhase ^ Abc_InfoHasBit((unsigned *)pSim0, iPat)) == Abc_InfoHasBit((unsigned *)pSim1, iPat) )
                Count++;
        }
    }
    clk = Abc_Clock();
    Gia_ManForEachClass0( p, i )
        Cec2_ManSimClassRefineOne( p, i );
    pMan->timeRefine += Abc_Clock() - clk;
    return Count;
}